

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ModuleCloner.h
# Opt level: O0

int __thiscall
soul::ModuleCloner::clone
          (ModuleCloner *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  bool bVar1;
  ArrayWithPreallocation<soul::pool_ref<soul::heart::Variable>,_4UL> *this_00;
  Variable *pVVar2;
  vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
  *pvVar3;
  size_type sVar4;
  pool_ref *ppVar5;
  Block *pBVar6;
  Block *__child_stack_00;
  int __flags_00;
  ulong local_b0;
  size_t i;
  pool_ref *local_a0;
  pool_ref<soul::heart::Block> *b;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
  *__range2_1;
  pool_ref<soul::heart::Variable> *local_78;
  pool_ref<soul::heart::Variable> *p;
  pool_ref<soul::heart::Variable> *__end2;
  pool_ref<soul::heart::Variable> *__begin2;
  ArrayWithPreallocation<soul::pool_ref<soul::heart::Variable>,_4UL> *__range2;
  string *local_50;
  Type local_38;
  void *local_20;
  Function *old_local;
  Function *f_local;
  ModuleCloner *this_local;
  
  local_20 = __child_stack;
  old_local = (Function *)__fn;
  f_local = (Function *)this;
  std::
  unordered_map<soul::pool_ref<const_soul::heart::Block>,_soul::pool_ptr<soul::heart::Block>,_std::hash<soul::pool_ref<const_soul::heart::Block>_>,_std::equal_to<soul::pool_ref<const_soul::heart::Block>_>,_std::allocator<std::pair<const_soul::pool_ref<const_soul::heart::Block>,_soul::pool_ptr<soul::heart::Block>_>_>_>
  ::clear(&this->blockMappings);
  CodeLocation::operator=(&(old_local->super_Object).location,(CodeLocation *)((long)local_20 + 8));
  cloneType(&local_38,this,(Type *)((long)local_20 + 0x18));
  Type::operator=(&old_local->returnType,&local_38);
  Type::~Type(&local_38);
  local_50 = (string *)
             heart::Allocator::get<soul::Identifier>
                       (this->newModule->allocator,(Identifier *)((long)local_20 + 0x30));
  (old_local->name).name = local_50;
  __range2._4_4_ = *(Type *)((long)local_20 + 0xd0);
  heart::FunctionType::operator=(&old_local->functionType,__range2._4_4_);
  old_local->intrinsicType = *(IntrinsicType *)((long)local_20 + 0xb8);
  old_local->isExported = (bool)(*(byte *)((long)local_20 + 0xd4) & 1);
  old_local->hasNoBody = (bool)(*(byte *)((long)local_20 + 0xd5) & 1);
  Annotation::operator=(&old_local->annotation,(Annotation *)((long)local_20 + 0x88));
  __begin2 = (pool_ref<soul::heart::Variable> *)((long)local_20 + 0x38);
  __end2 = ArrayWithPreallocation<soul::pool_ref<soul::heart::Variable>,_4UL>::begin
                     ((ArrayWithPreallocation<soul::pool_ref<soul::heart::Variable>,_4UL> *)__begin2
                     );
  p = ArrayWithPreallocation<soul::pool_ref<soul::heart::Variable>,_4UL>::end
                ((ArrayWithPreallocation<soul::pool_ref<soul::heart::Variable>,_4UL> *)__begin2);
  for (; __end2 != p; __end2 = __end2 + 1) {
    local_78 = __end2;
    this_00 = &old_local->parameters;
    pVVar2 = pool_ref::operator_cast_to_Variable_((pool_ref *)__end2);
    pVVar2 = cloneVariable(this,pVVar2);
    pool_ref<soul::heart::Variable>::pool_ref<soul::heart::Variable,void>
              ((pool_ref<soul::heart::Variable> *)&__range2_1,pVVar2);
    ArrayWithPreallocation<soul::pool_ref<soul::heart::Variable>,_4UL>::push_back
              (this_00,(pool_ref<soul::heart::Variable> *)&__range2_1);
    pool_ref<soul::heart::Variable>::~pool_ref((pool_ref<soul::heart::Variable> *)&__range2_1);
  }
  pvVar3 = (vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
            *)((long)local_20 + 0x70);
  __end2_1 = std::
             vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
             ::begin(pvVar3);
  b = (pool_ref<soul::heart::Block> *)
      std::
      vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
      ::end(pvVar3);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2_1,
                       (__normal_iterator<const_soul::pool_ref<soul::heart::Block>_*,_std::vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>_>
                        *)&b);
    if (!bVar1) break;
    local_a0 = (pool_ref *)
               __gnu_cxx::
               __normal_iterator<const_soul::pool_ref<soul::heart::Block>_*,_std::vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>_>
               ::operator*(&__end2_1);
    pvVar3 = &old_local->blocks;
    pBVar6 = pool_ref::operator_cast_to_Block_(local_a0);
    pBVar6 = createNewBlock(this,pBVar6);
    pool_ref<soul::heart::Block>::pool_ref<soul::heart::Block,void>
              ((pool_ref<soul::heart::Block> *)&i,pBVar6);
    std::
    vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
    ::push_back(pvVar3,(pool_ref<soul::heart::Block> *)&i);
    pool_ref<soul::heart::Block>::~pool_ref((pool_ref<soul::heart::Block> *)&i);
    __gnu_cxx::
    __normal_iterator<const_soul::pool_ref<soul::heart::Block>_*,_std::vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>_>
    ::operator++(&__end2_1);
  }
  local_b0 = 0;
  while( true ) {
    sVar4 = std::
            vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
            ::size(&old_local->blocks);
    if (sVar4 <= local_b0) break;
    ppVar5 = (pool_ref *)
             std::
             vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
             ::operator[](&old_local->blocks,local_b0);
    __flags_00 = (int)sVar4;
    pBVar6 = pool_ref::operator_cast_to_Block_(ppVar5);
    ppVar5 = (pool_ref *)
             std::
             vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
             ::operator[]((vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
                           *)((long)local_20 + 0x70),local_b0);
    __child_stack_00 = pool_ref::operator_cast_to_Block_(ppVar5);
    clone(this,(__fn *)pBVar6,__child_stack_00,__flags_00,__arg);
    local_b0 = local_b0 + 1;
  }
  return (int)local_b0;
}

Assistant:

void clone (heart::Function& f, const heart::Function& old)
    {
        blockMappings.clear();

        f.location = old.location;
        f.returnType = cloneType (old.returnType);
        f.name = newModule.allocator.get (old.name);
        f.functionType = old.functionType;
        f.intrinsicType = old.intrinsicType;
        f.isExported = old.isExported;
        f.hasNoBody = old.hasNoBody;
        f.annotation = old.annotation;

        for (auto& p : old.parameters)
            f.parameters.push_back (cloneVariable (p));

        for (auto& b : old.blocks)
            f.blocks.push_back (createNewBlock (b));

        for (size_t i = 0; i < f.blocks.size(); ++i)
            clone (f.blocks[i], old.blocks[i]);
    }